

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O2

void deqp::gls::ub::anon_unknown_12::collectUniqueBasicTypes
               (set<glu::DataType,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>
                *basicTypes,VarType *type)

{
  StructType *pSVar1;
  pointer pSVar2;
  DataType local_1c;
  
  for (; type->m_type == TYPE_ARRAY; type = (type->m_data).array.elementType) {
  }
  if (type->m_type == TYPE_STRUCT) {
    pSVar1 = (type->m_data).structPtr;
    for (pSVar2 = (pSVar1->m_members).
                  super__Vector_base<deqp::gls::ub::StructMember,_std::allocator<deqp::gls::ub::StructMember>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pSVar2 != (pSVar1->m_members).
                  super__Vector_base<deqp::gls::ub::StructMember,_std::allocator<deqp::gls::ub::StructMember>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pSVar2 = pSVar2 + 1) {
      collectUniqueBasicTypes(basicTypes,&pSVar2->m_type);
      pSVar1 = (type->m_data).structPtr;
    }
  }
  else {
    local_1c = (type->m_data).basicType;
    std::
    _Rb_tree<glu::DataType,_glu::DataType,_std::_Identity<glu::DataType>,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>
    ::_M_insert_unique<glu::DataType>(&basicTypes->_M_t,&local_1c);
  }
  return;
}

Assistant:

void collectUniqueBasicTypes (std::set<glu::DataType>& basicTypes, const VarType& type)
{
	if (type.isStructType())
	{
		for (StructType::ConstIterator iter = type.getStruct().begin(); iter != type.getStruct().end(); ++iter)
			collectUniqueBasicTypes(basicTypes, iter->getType());
	}
	else if (type.isArrayType())
		collectUniqueBasicTypes(basicTypes, type.getElementType());
	else
	{
		DE_ASSERT(type.isBasicType());
		basicTypes.insert(type.getBasicType());
	}
}